

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O2

double tour_eval(Instance *instance,Tour *tour)

{
  int iVar1;
  int32_t *piVar2;
  int32_t i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar6 = INFINITY;
  if (tour->num_comps == 1) {
    for (iVar3 = 0; iVar3 <= tour->num_customers; iVar3 = iVar3 + 1) {
      piVar2 = tsucc(tour,iVar3);
      iVar1 = *piVar2;
      if ((-1 < iVar1) &&
         ((piVar2 = tcomp(tour,iVar3), *piVar2 != 0 || (tour->num_customers < iVar1)))) {
        return INFINITY;
      }
    }
    local_48 = *instance->profits + 0.0;
    dStack_40 = *instance->demands + 0.0;
    local_38 = 0.0;
    iVar3 = 0;
    while( true ) {
      piVar2 = tsucc(tour,iVar3);
      iVar1 = *piVar2;
      lVar4 = (long)iVar1;
      if (lVar4 == 0) break;
      if (iVar1 == iVar3) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar6 = cptp_dist(instance,iVar3,iVar1);
      local_38 = local_38 + dVar6;
      local_48 = local_48 + instance->profits[lVar4];
      dStack_40 = dStack_40 + instance->demands[lVar4];
      iVar3 = iVar1;
    }
    dVar6 = cptp_dist(instance,iVar3,0);
    uVar5 = -(ulong)(instance->vehicle_cap < dStack_40);
    dVar6 = (double)(uVar5 & 0x7ff0000000000000 | ~uVar5 & (ulong)((local_38 + dVar6) - local_48));
  }
  return dVar6;
}

Assistant:

static inline double tour_eval(const Instance *instance, Tour *tour) {
    if (tour->num_comps != 1) {
        return INFINITY;
    }

    for (int32_t i = 0; i < tour->num_customers + 1; i++) {
        int32_t succ = *tsucc(tour, i);
        if (succ >= 0) {
            if (*tcomp(tour, i) != 0 || succ >= tour->num_customers + 1) {
                return INFINITY;
            }
        }
    }

    double cost = 0.0;
    double profit = 0.0;
    double demands = 0.0;

    int32_t curr_vertex = 0;
    int32_t next_vertex = -1;

    profit += instance->profits[0];
    demands += instance->demands[0];

    while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
        assert(next_vertex != curr_vertex);
        cost += cptp_dist(instance, curr_vertex, next_vertex);
        profit += instance->profits[next_vertex];
        demands += instance->demands[next_vertex];
        curr_vertex = next_vertex;
    }

    cost += cptp_dist(instance, curr_vertex, 0);

    if (demands > instance->vehicle_cap) {
        return INFINITY;
    } else {
        return cost - profit;
    }
}